

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::ClipperOffset::FixOrientations(ClipperOffset *this)

{
  PolyNode *pPVar1;
  pointer pIVar2;
  double dVar3;
  cInt cVar4;
  cInt cVar5;
  cInt cVar6;
  pointer pIVar7;
  pointer pIVar8;
  long lVar9;
  
  lVar9 = (this->m_lowest).X;
  if ((lVar9 < 0) ||
     (dVar3 = Area(&(this->m_polyNodes).Childs.
                    super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[(int)lVar9]->Contour), 0.0 <= dVar3))
  {
    if (0 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_polyNodes).Childs.
                               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      lVar9 = 0;
      do {
        pPVar1 = (this->m_polyNodes).Childs.
                 super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9];
        if ((pPVar1->m_endtype == etClosedLine) && (dVar3 = Area(&pPVar1->Contour), dVar3 < 0.0)) {
          pIVar2 = (pPVar1->Contour).
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pIVar7 = *(pointer *)
                    ((long)&(pPVar1->Contour).
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl + 8);
          pIVar8 = pIVar7 + -1;
          if (pIVar2 < pIVar8 && pIVar2 != pIVar7) {
            do {
              pIVar7 = pIVar2 + 1;
              cVar4 = pIVar2->X;
              cVar5 = pIVar2->Y;
              cVar6 = pIVar8->Y;
              pIVar2->X = pIVar8->X;
              pIVar2->Y = cVar6;
              pIVar8->X = cVar4;
              pIVar8->Y = cVar5;
              pIVar8 = pIVar8 + -1;
              pIVar2 = pIVar7;
            } while (pIVar7 < pIVar8);
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                           super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->m_polyNodes).Childs.
                                          super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
  }
  else if (0 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                   super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_polyNodes).Childs.
                                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar9 = 0;
    do {
      pPVar1 = (this->m_polyNodes).Childs.
               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar9];
      if ((pPVar1->m_endtype == etClosedPolygon) ||
         ((pPVar1->m_endtype == etClosedLine && (dVar3 = Area(&pPVar1->Contour), 0.0 <= dVar3)))) {
        pIVar2 = (pPVar1->Contour).
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pIVar7 = *(pointer *)
                  ((long)&(pPVar1->Contour).
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl + 8);
        pIVar8 = pIVar7 + -1;
        if (pIVar2 < pIVar8 && pIVar2 != pIVar7) {
          do {
            pIVar7 = pIVar2 + 1;
            cVar4 = pIVar2->X;
            cVar5 = pIVar2->Y;
            cVar6 = pIVar8->Y;
            pIVar2->X = pIVar8->X;
            pIVar2->Y = cVar6;
            pIVar8->X = cVar4;
            pIVar8->Y = cVar5;
            pIVar8 = pIVar8 + -1;
            pIVar2 = pIVar7;
          } while (pIVar7 < pIVar8);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                         super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_polyNodes).Childs.
                                        super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  return;
}

Assistant:

void ClipperOffset::FixOrientations()
{
  //fixup orientations of all closed paths if the orientation of the
  //closed path with the lowermost vertex is wrong ...
  if (m_lowest.X >= 0 && 
    !Orientation(m_polyNodes.Childs[(int)m_lowest.X]->Contour))
  {
    for (int i = 0; i < m_polyNodes.ChildCount(); ++i)
    {
      PolyNode& node = *m_polyNodes.Childs[i];
      if (node.m_endtype == etClosedPolygon ||
        (node.m_endtype == etClosedLine && Orientation(node.Contour)))
          ReversePath(node.Contour);
    }
  } else
  {
    for (int i = 0; i < m_polyNodes.ChildCount(); ++i)
    {
      PolyNode& node = *m_polyNodes.Childs[i];
      if (node.m_endtype == etClosedLine && !Orientation(node.Contour))
        ReversePath(node.Contour);
    }
  }
}